

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Accuracy::Texture2DFilteringCase::deinit(Texture2DFilteringCase *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  
  for (ppTVar2 = (this->m_textures).
                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar2 !=
      (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    if (*ppTVar2 != (Texture2D *)0x0) {
      (*(*ppTVar2)->_vptr_Texture2D[1])();
    }
  }
  ppTVar1 = (this->m_textures).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar2 != ppTVar1) {
    (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar1;
  }
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  return;
}

Assistant:

void Texture2DFilteringCase::deinit (void)
{
	for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();

	m_renderer.clear();
}